

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall PointerType::PointerType(PointerType *this,Type *type)

{
  ret_type this_00;
  ret_type pSVar1;
  _func_int **in_RSI;
  Type *in_RDI;
  ret_type ST;
  ret_type AT;
  ret_type PT;
  Type *in_stack_ffffffffffffff70;
  string local_50 [32];
  ret_type local_30;
  
  Type::Type(in_RDI,TK_PointerType);
  in_RDI->_vptr_Type = (_func_int **)&PTR__PointerType_003008b8;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)&in_RDI[4].kind);
  in_RDI[1].kind = TK_StructType;
  in_RDI[1].isConst = false;
  *(undefined1 *)&in_RDI[4]._vptr_Type = 0;
  this_00 = llvm::dyn_cast_or_null<PointerType,Type>(in_stack_ffffffffffffff70);
  if (this_00 != (ret_type)0x0) {
    in_RDI[1].isConst = (bool)(this_00->isArrayPointer & 1);
    *(byte *)&in_RDI[4]._vptr_Type = this_00->isStructPointer & 1;
    std::__cxx11::string::operator=((string *)&in_RDI[4].kind,(string *)&this_00->structName);
    in_RDI[1].kind = this_00->levels + TK_StructType;
    std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)&this_00->sizes);
  }
  local_30 = llvm::dyn_cast_or_null<ArrayType,Type>(in_stack_ffffffffffffff70);
  if (local_30 != (ret_type)0x0) {
    in_RDI[1].isConst = true;
    ArrayType::sizeToString_abi_cxx11_((ArrayType *)this_00);
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_50);
    std::__cxx11::string::~string(local_50);
    *(byte *)&in_RDI[4]._vptr_Type = local_30->isStructArray & 1;
    std::__cxx11::string::operator=((string *)&in_RDI[4].kind,(string *)&local_30->structName);
  }
  pSVar1 = llvm::dyn_cast_or_null<StructType,Type>(in_stack_ffffffffffffff70);
  if (pSVar1 != (ret_type)0x0) {
    *(undefined1 *)&in_RDI[4]._vptr_Type = 1;
    std::__cxx11::string::operator=
              ((string *)&in_RDI[4].kind,(string *)&(pSVar1->super_AggregateType).name);
  }
  in_RDI[1]._vptr_Type = in_RSI;
  return;
}

Assistant:

PointerType::PointerType(Type* type): Type(TK_PointerType) {
    levels = 1;
    isArrayPointer = false;
    isStructPointer = false;

    if (auto PT = llvm::dyn_cast_or_null<PointerType>(type)) {
        isArrayPointer = PT->isArrayPointer;
        isStructPointer = PT->isStructPointer;
        structName = PT->structName;
        levels = PT->levels + 1;
        sizes = PT->sizes;
    }

    if (auto AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        isArrayPointer = true;
        sizes = AT->sizeToString();

        isStructPointer = AT->isStructArray;
        structName = AT->structName;
    }

    if (auto ST = llvm::dyn_cast_or_null<StructType>(type)) {
        isStructPointer = true;
        structName = ST->name;
    }

    this->type = type;
}